

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::SGXMLScanner::scanCharData(SGXMLScanner *this,XMLBuffer *toUse)

{
  XMLReader *pXVar1;
  ReaderMgr *this_00;
  bool bVar2;
  bool bVar3;
  XMLCh XVar4;
  bool bVar5;
  int iVar6;
  XMLSize_t XVar7;
  XMLCh *pXVar8;
  StackElem *pSVar9;
  ComplexTypeInfo **ppCVar10;
  ulong uVar11;
  XMLSize_t XVar12;
  XMLCh XVar13;
  int iVar14;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh tmpBuf [9];
  char local_57;
  XMLCh local_56;
  bool local_53;
  XMLCh local_52;
  XMLBuffer *local_50;
  XMLCh local_48 [12];
  
  toUse->fIndex = 0;
  local_53 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = true;
  local_52 = L'\0';
  local_57 = '\0';
  local_50 = toUse;
  bVar5 = false;
  iVar14 = 0;
LAB_002b49b9:
  bVar2 = bVar5;
  if ((iVar14 == 0) && (!bVar2)) {
    pXVar1 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    XVar7 = pXVar1->fCharsAvail - pXVar1->fCharIndex;
    if (XVar7 != 0) {
      XVar12 = 0;
      do {
        if ((pXVar1->fgCharCharsTable[(ushort)(pXVar1->fCharBuf + pXVar1->fCharIndex)[XVar12]] & 8)
            == 0) {
          XVar7 = XVar12;
          if (XVar12 == 0) goto LAB_002b4a29;
          break;
        }
        XVar12 = XVar12 + 1;
      } while (XVar7 != XVar12);
      XMLBuffer::append(local_50,pXVar1->fCharBuf + pXVar1->fCharIndex,XVar7);
      pXVar1->fCharIndex = pXVar1->fCharIndex + XVar7;
      pXVar1->fCurCol = pXVar1->fCurCol + XVar7;
    }
  }
LAB_002b4a29:
  pXVar1 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  uVar11 = pXVar1->fCharIndex;
  if (pXVar1->fCharsAvail <= uVar11) {
    if ((pXVar1->fNoMore != false) || (bVar5 = XMLReader::refreshCharBuffer(pXVar1), !bVar5)) {
LAB_002b4b04:
      if (bVar2) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      if (((this->super_XMLScanner).fValidate == true) &&
         ((this->super_XMLScanner).fStandalone == true)) {
        XVar7 = local_50->fIndex;
        pXVar8 = local_50->fBuffer;
        pXVar8[XVar7] = L'\0';
        bVar5 = XMLReader::containsWhiteSpace
                          ((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar8,XVar7);
        if ((bVar5) &&
           ((pSVar9 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack),
            pSVar9->fThisElement->fExternalElement == true &&
            (this_00 = (this->super_XMLScanner).fValidator[4].fReaderMgr,
            this_00->fCurReader != (XMLReader *)0x0)))) {
          ppCVar10 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                               ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)this_00);
          if ((*ppCVar10 != (ComplexTypeInfo *)0x0) &&
             (((*ppCVar10)->fContentType & 0xfffffffdU) == 4)) {
            XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
          }
        }
      }
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                (this,local_50);
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = local_53;
      return;
    }
    uVar11 = pXVar1->fCharIndex;
  }
  XVar13 = pXVar1->fCharBuf[uVar11];
  if (XVar13 != L'<') {
    pXVar1->fCharIndex = uVar11 + 1;
    local_56 = XVar13;
    if ((XVar13 & 0xdf50U) == 0) {
      XMLReader::handleEOL(pXVar1,&local_56,false);
    }
    else {
      pXVar1->fCurCol = pXVar1->fCurCol + 1;
    }
    local_57 = '\0';
    if (local_56 == L'&') goto code_r0x002b4aae;
    if ((local_56 & 0xfc00U) == 0xdc00) {
      if (!bVar2) {
        XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
      }
LAB_002b4bd1:
      bVar3 = false;
    }
    else {
      if ((local_56 & 0xfc00U) != 0xd800) {
        if (bVar2) {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        }
        if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)local_56] &
            0x40) == 0) {
          XMLString::binToText
                    ((uint)(ushort)local_56,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager)
          ;
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        goto LAB_002b4bd1;
      }
      bVar3 = true;
      if (bVar2) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        bVar3 = bVar2;
      }
    }
    goto LAB_002b4bd3;
  }
  goto LAB_002b4b04;
code_r0x002b4aae:
  (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
            (this,local_50);
  bVar5 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = false;
  iVar6 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                    (this,0,&local_56,&local_52,&local_57);
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar5;
  bVar5 = false;
  bVar3 = bVar2;
  if (iVar6 == 1) {
LAB_002b4bd3:
    iVar6 = 0;
    XVar13 = local_56;
    if (local_57 == '\0') {
      if (local_56 == L'>') {
        XVar13 = L'>';
        if (iVar14 == 2) {
          XMLScanner::emitError(&this->super_XMLScanner,BadSequenceInCharData);
          XVar13 = local_56;
        }
      }
      else if (local_56 == L']') {
        XVar13 = L']';
        if (iVar14 == 0) {
          iVar6 = 1;
        }
        else {
          iVar6 = iVar14;
          if (iVar14 == 1) {
            iVar6 = 2;
          }
        }
      }
    }
    XVar7 = local_50->fIndex;
    if (XVar7 == local_50->fCapacity) {
      XMLBuffer::ensureCapacity(local_50,1);
      XVar7 = local_50->fIndex;
    }
    XVar4 = local_52;
    pXVar8 = local_50->fBuffer;
    XVar12 = XVar7 + 1;
    local_50->fIndex = XVar12;
    pXVar8[XVar7] = XVar13;
    bVar5 = bVar3;
    iVar14 = iVar6;
    if (local_52 != L'\0') {
      if (XVar12 == local_50->fCapacity) {
        XMLBuffer::ensureCapacity(local_50,1);
        XVar12 = local_50->fIndex;
        pXVar8 = local_50->fBuffer;
      }
      local_50->fIndex = XVar12 + 1;
      pXVar8[XVar12] = XVar4;
      local_52 = L'\0';
    }
  }
  goto LAB_002b49b9;
}

Assistant:

void SGXMLScanner::scanCharData(XMLBuffer& toUse)
{
    //  We have to watch for the stupid ]]> sequence, which is illegal in
    //  character data. So this is a little state machine that handles that.
    enum States
    {
        State_Waiting
        , State_GotOne
        , State_GotTwo
    };

    // Reset the buffer before we start
    toUse.reset();

    // Turn on the 'throw at end' flag of the reader manager
    ThrowEOEJanitor jan(&fReaderMgr, true);

    //  In order to be more efficient we have to use kind of a deeply nested
    //  set of blocks here. The outer block puts on a try and catches end of
    //  entity exceptions. The inner loop is the per-character loop. If we
    //  put the try inside the inner loop, it would work but would require
    //  the exception handling code setup/teardown code to be invoked for
    //  each character.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = State_Waiting;
    bool    escaped = false;
    bool    gotLeadingSurrogate = false;
    bool    notDone = true;
    while (notDone)
    {
        try
        {
            while (true)
            {
                //  Eat through as many plain content characters as possible without
                //  needing special handling.  Moving most content characters here,
                //  in this one call, rather than running the overall loop once
                //  per content character, is a speed optimization.
                if (curState == State_Waiting  &&  !gotLeadingSurrogate)
                {
                     fReaderMgr.movePlainContentChars(toUse);
                }

                // Try to get another char from the source
                //   The code from here on down covers all contengencies,
                if (!fReaderMgr.getNextCharIfNot(chOpenAngle, nextCh))
                {
                    // If we were waiting for a trailing surrogate, its an error
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    notDone = false;
                    break;
                }

                //  Watch for a reference. Note that the escapement mechanism
                //  is ignored in this content.
                escaped = false;
                if (nextCh == chAmpersand)
                {
                    sendCharData(toUse);

                    // Turn off the throwing at the end of entity during this
                    ThrowEOEJanitor jan(&fReaderMgr, false);

                    if (scanEntityRef(false, nextCh, secondCh, escaped) != EntityExp_Returned)
                    {
                        gotLeadingSurrogate = false;
                        continue;
                    }
                }
                else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
                {
                    // Deal with surrogate pairs
                    //  Its a leading surrogate. If we already got one, then
                    //  issue an error, else set leading flag to make sure that
                    //  we look for a trailing next time.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    else
                        gotLeadingSurrogate = true;
                }
                else
                {
                    //  If its a trailing surrogate, make sure that we are
                    //  prepared for that. Else, its just a regular char so make
                    //  sure that we were not expected a trailing surrogate.
                    if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                    {
                        // Its trailing, so make sure we were expecting it
                        if (!gotLeadingSurrogate)
                            emitError(XMLErrs::Unexpected2ndSurrogateChar);
                    }
                    else
                    {
                        //  Its just a char, so make sure we were not expecting a
                        //  trailing surrogate.
                        if (gotLeadingSurrogate)
                            emitError(XMLErrs::Expected2ndSurrogateChar);

                        // Make sure the returned char is a valid XML char
                        if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                        {
                            XMLCh tmpBuf[9];
                            XMLString::binToText
                            (
                                nextCh
                                , tmpBuf
                                , 8
                                , 16
                                , fMemoryManager
                            );
                            emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        }
                    }
                    gotLeadingSurrogate = false;
                }

                // Keep the state machine up to date
                if (!escaped)
                {
                    if (nextCh == chCloseSquare)
                    {
                        if (curState == State_Waiting)
                            curState = State_GotOne;
                        else if (curState == State_GotOne)
                            curState = State_GotTwo;
                    }
                    else if (nextCh == chCloseAngle)
                    {
                        if (curState == State_GotTwo)
                            emitError(XMLErrs::BadSequenceInCharData);
                        curState = State_Waiting;
                    }
                    else
                    {
                        curState = State_Waiting;
                    }
                }
                else
                {
                    curState = State_Waiting;
                }

                // Add this char to the buffer
                toUse.append(nextCh);

                if (secondCh)
                {
                    toUse.append(secondCh);
                    secondCh=0;
                }
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  Some entity ended, so we have to send any accumulated
            //  chars and send an end of entity event.
            sendCharData(toUse);
            gotLeadingSurrogate = false;

            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());
        }
    }

    // Check the validity constraints as per XML 1.0 Section 2.9
    if (fValidate && fStandalone)
    {
        // See if the text contains whitespace
        // Get the raw data we need for the callback
        const XMLCh* rawBuf = toUse.getRawBuffer();
        const XMLSize_t len = toUse.getLen();
        const bool isSpaces = fReaderMgr.getCurrentReader()->containsWhiteSpace(rawBuf, len);

        if (isSpaces)
        {
            // And see if the current element is a 'Children' style content model
            const ElemStack::StackElem* topElem = fElemStack.topElement();

            if (topElem->fThisElement->isExternal()) {

                // Get the character data opts for the current element
                XMLElementDecl::CharDataOpts charOpts = XMLElementDecl::AllCharData;
                // And see if the current element is a 'Children' style content model
                ComplexTypeInfo *currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
                if(currType)
                {
                    SchemaElementDecl::ModelTypes modelType = (SchemaElementDecl::ModelTypes) currType->getContentType();
                    if(modelType == SchemaElementDecl::Children ||
                       modelType == SchemaElementDecl::ElementOnlyEmpty)
                        charOpts = XMLElementDecl::SpacesOk;
                }

                if (charOpts == XMLElementDecl::SpacesOk)  // => Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    //
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                    if (getPSVIHandler())
                    {
                        // REVISIT:
                        // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                    }
                }
            }
        }
    }
    // Send any char data that we accumulated into the buffer
    sendCharData(toUse);
}